

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  uint uVar1;
  TextRange *pTVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  int i;
  ulong uVar8;
  TextRange input_range;
  char *pcVar7;
  
  ImVector<ImGuiTextFilter::TextRange>::resize(&this->Filters,0);
  sVar3 = strlen(this->InputBuf);
  input_range.e = this->InputBuf + sVar3;
  input_range.b = this->InputBuf;
  TextRange::split(&input_range,',',&this->Filters);
  this->CountGrep = 0;
  uVar1 = (this->Filters).Size;
  pTVar2 = (this->Filters).Data;
  iVar4 = 0;
  for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
    pcVar5 = pTVar2[uVar8].b;
    pcVar7 = pTVar2[uVar8].e;
    while ((pcVar5 < pcVar7 && ((*pcVar5 == ' ' || (*pcVar5 == '\t'))))) {
      pcVar5 = pcVar5 + 1;
      pTVar2[uVar8].b = pcVar5;
    }
    while ((pcVar6 = pcVar7 + -1, pcVar5 < pcVar7 && ((*pcVar6 == ' ' || (*pcVar6 == '\t'))))) {
      pTVar2[uVar8].e = pcVar6;
      pcVar7 = pcVar6;
    }
    if ((pcVar7 != pcVar5) && (*pcVar5 != '-')) {
      iVar4 = iVar4 + 1;
      this->CountGrep = iVar4;
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        TextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}